

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

bool __thiscall Clasp::SharedContext::attach(SharedContext *this,Solver *other)

{
  uint32 *puVar1;
  uint32 numConsGuess;
  uint uVar2;
  size_type sVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  SolverParams *params;
  undefined4 extraout_var;
  Solver *pSVar8;
  long *plVar9;
  uint uVar10;
  ulong uVar11;
  Literal x;
  Antecedent null;
  Constraint *pCVar7;
  
  if ((this->step_).rep_ >> 2 <= (other->assign_).assign_.ebo_.size - 1) {
    bVar5 = Solver::popRootLevel(other,(other->levels_).root,(LitVec *)0x0,true);
    if (!bVar5) {
      return false;
    }
    if (*(this->solvers_).ebo_.buf == other) {
      return true;
    }
  }
  initStats(this,other);
  uVar10 = (other->assign_).assign_.ebo_.size;
  numConsGuess = ((*(this->solvers_).ebo_.buf)->constraints_).ebo_.size;
  plVar9 = (long *)((this->config_).ptr_ & 0xfffffffffffffffe);
  params = (SolverParams *)(**(code **)(*plVar9 + 0x30))(plVar9,(ulong)other->strategy_ >> 0x3a);
  Solver::startInit(other,numConsGuess,params);
  if ((other->conflict_).ebo_.size == 0) {
    null.data_ = 0;
    uVar2 = ((*(this->solvers_).ebo_.buf)->assign_).trail.ebo_.size;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      pSVar8 = *(this->solvers_).ebo_.buf;
      x.rep_ = (pSVar8->assign_).trail.ebo_.buf[uVar11].rep_;
      if ((x.rep_ >> 2 <= (pSVar8->shared_->varInfo_).ebo_.size - 1) &&
         (bVar5 = Solver::force(other,&x,&null), !bVar5)) {
        return false;
      }
    }
    if ((this->satPrepro).ptr_ < 2) {
      uVar10 = 0x40000000;
    }
    pSVar8 = *(this->solvers_).ebo_.buf;
    sVar3 = (pSVar8->assign_).assign_.ebo_.size;
    puVar4 = (other->assign_).assign_.ebo_.buf;
    for (; uVar10 <= sVar3 - 1; uVar10 = uVar10 + 1) {
      if ((0xffffffef < (pSVar8->assign_).assign_.ebo_.buf[uVar10]) &&
         (uVar2 = puVar4[uVar10], uVar2 < 0xfffffff0 && (uVar2 & 3) == 0)) {
        puVar4[uVar10] = 0xfffffff1;
        puVar1 = &(other->assign_).elims_;
        *puVar1 = *puVar1 + 1;
      }
    }
    if ((other->constraints_).ebo_.size == 0) {
      *(uint *)&other->field_0x204 =
           *(uint *)&other->field_0x204 & 0xc0000000 | *(uint *)&pSVar8->field_0x204 & 0x3fffffff;
      pSVar8 = *(this->solvers_).ebo_.buf;
    }
    bVar5 = Solver::cloneDB(other,&pSVar8->constraints_);
    if (bVar5) {
      pCVar7 = (*(this->solvers_).ebo_.buf)->enum_;
      if (pCVar7 == (Constraint *)0x0) {
        pCVar7 = (Constraint *)0x0;
      }
      else {
        iVar6 = (*pCVar7->_vptr_Constraint[2])(pCVar7,other);
        pCVar7 = (Constraint *)CONCAT44(extraout_var,iVar6);
      }
      Solver::setEnumerationConstraint(other,pCVar7);
      pSVar8 = other;
      bVar5 = Solver::preparePost(other);
      if ((bVar5) && (pSVar8 = other, bVar5 = Solver::endInit(other), bVar5)) {
        return true;
      }
      detach((SharedContext *)pSVar8,other,false);
      return false;
    }
  }
  return false;
}

Assistant:

bool SharedContext::attach(Solver& other) {
	assert(frozen() && other.shared_ == this);
	if (other.validVar(step_.var())) {
		if (!other.popRootLevel(other.rootLevel())){ return false; }
		if (&other == master())                    { return true;  }
	}
	initStats(other);
	// 1. clone vars & assignment
	Var lastVar = other.numVars();
	other.startInit(static_cast<uint32>(master()->constraints_.size()), configuration()->solver(other.id()));
	if (other.hasConflict()) { return false; }
	Antecedent null;
	for (LitVec::size_type i = 0, end = master()->trail().size(); i != end; ++i) {
		Literal x = master()->trail()[i];
		if (master()->auxVar(x.var())) { continue;  }
		if (!other.force(x, null))     { return false; }
	}
	for (Var v = satPrepro.get() ? lastVar+1 : varMax, end = master()->numVars(); v <= end; ++v) {
		if (eliminated(v) && other.value(v) == value_free) {
			other.assign_.eliminate(v);
		}
	}
	if (other.constraints_.empty()) { other.lastSimp_ = master()->lastSimp_; }
	// 2. clone & attach constraints
	if (!other.cloneDB(master()->constraints_)) { return false; }
	Constraint* c = master()->enumerationConstraint();
	other.setEnumerationConstraint( c ? c->cloneAttach(other) : 0 );
	// 3. endInit
	return (other.preparePost() && other.endInit()) || (detach(other, false), false);
}